

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O2

void fe_carry(fe *h,fe_loose *f)

{
  uint64_t *puVar1;
  uint _assert_fe_i;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  lVar2 = 0;
  do {
    if (lVar2 == 5) {
      uVar4 = (f->v[0] >> 0x33) + f->v[1];
      uVar3 = (uVar4 >> 0x33) + f->v[2];
      uVar5 = (uVar3 >> 0x33) + f->v[3];
      uVar6 = (uVar5 >> 0x33) + f->v[4];
      uVar7 = (uVar6 >> 0x33) * 0x13 + (f->v[0] & 0x7ffffffffffff);
      uVar4 = (uVar4 & 0x7ffffffffffff) + (uVar7 >> 0x33);
      h->v[0] = uVar7 & 0x7ffffffffffff;
      h->v[1] = uVar4 & 0x7ffffffffffff;
      h->v[2] = (uVar3 & 0x7ffffffffffff) + (uVar4 >> 0x33);
      h->v[3] = uVar5 & 0x7ffffffffffff;
      h->v[4] = uVar6 & 0x7ffffffffffff;
      lVar2 = 0;
      do {
        if (lVar2 == 5) {
          return;
        }
        puVar1 = h->v + lVar2;
        lVar2 = lVar2 + 1;
      } while (*puVar1 < 0x8cccccccccccd);
      __assert_fail("constant_time_declassify_int(h->v[_assert_fe_i] <= 0x8ccccccccccccUL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                    ,0xcf,"void fe_carry(fe *, const fe_loose *)");
    }
    puVar1 = f->v + lVar2;
    lVar2 = lVar2 + 1;
  } while (*puVar1 < 0x1a666666666665);
  __assert_fail("constant_time_declassify_int(f->v[_assert_fe_i] <= 0x1a666666666664UL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                ,0xcd,"void fe_carry(fe *, const fe_loose *)");
}

Assistant:

static void fe_carry(fe *h, const fe_loose *f) {
  assert_fe_loose(f->v);
  fiat_25519_carry(h->v, f->v);
  assert_fe(h->v);
}